

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O0

void Js::CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
               (char16 *s,CharCount appendCharLength,Builder<256U> *toString,bool appendChars)

{
  char16 c_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContext *scriptContext;
  JavascriptString *s_00;
  char16_t *pcVar4;
  char16_t *pcVar5;
  JavascriptString *js;
  char16 c;
  bool appendChars_local;
  Builder<256U> *toString_local;
  CharCount appendCharLength_local;
  char16 *s_local;
  
  if (s == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x4b4,"(s)","s");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (toString == (Builder<256U> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x4b5,"(toString)","toString");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = Builder<256U>::IsFinalized(toString);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x4b6,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = Builder<256U>::OwnsLastBlock(toString);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x4b7,"(toString->OwnsLastBlock())","toString->OwnsLastBlock()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((appendChars) && (bVar2 = Builder<256U>::HasOnlyDirectChars(toString), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x4b8,"(!(appendChars && !toString->HasOnlyDirectChars()))",
                                "!(appendChars && !toString->HasOnlyDirectChars())");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (appendCharLength != 0) {
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,StringConcatPhase);
    if (bVar2) {
      pcVar4 = L"";
      if (8 < appendCharLength) {
        pcVar4 = L"...";
      }
      pcVar5 = L"false";
      if (appendChars) {
        pcVar5 = L"true";
      }
      Output::Print(L"CompoundString::AppendGeneric(char16 *s = \"%.8s%s\", appendCharLength = %u, appendChars = %s)\n"
                    ,s,pcVar4,(ulong)appendCharLength,pcVar5);
      Output::Flush();
    }
    if ((appendChars) || (bVar2 = Builder<256U>::HasOnlyDirectChars(toString), bVar2)) {
      if (appendCharLength == 1) {
        c_00 = *s;
        bVar2 = TryAppendGeneric<Js::CompoundString::Builder<256u>>(c_00,toString);
        if (!bVar2) {
          Builder<256U>::AppendSlow(toString,c_00);
        }
      }
      else {
        bVar2 = TryAppendGeneric<Js::CompoundString::Builder<256u>>(s,appendCharLength,toString);
        if (!bVar2) {
          Builder<256U>::AppendSlow(toString,s,appendCharLength);
        }
      }
    }
    else {
      scriptContext = Builder<256U>::GetScriptContext(toString);
      s_00 = JavascriptString::NewCopyBuffer(s,appendCharLength,scriptContext);
      bVar2 = TryAppendGeneric<Js::CompoundString::Builder<256u>>(s_00,appendCharLength,toString);
      if (!bVar2) {
        Builder<256U>::AppendSlow(toString,s_00);
      }
    }
  }
  return;
}

Assistant:

inline void CompoundString::AppendGeneric(
        __in_xcount(appendCharLength) const char16 *const s,
        const CharCount appendCharLength,
        String *const toString,
        const bool appendChars)
    {
        Assert(s);
        Assert(toString);
        Assert(!toString->IsFinalized());
        Assert(toString->OwnsLastBlock());
        Assert(!(appendChars && !toString->HasOnlyDirectChars()));

        if(appendCharLength == 0)
            return;

        if(PHASE_TRACE_StringConcat)
        {
            Output::Print(
                _u("CompoundString::AppendGeneric(char16 *s = \"%.8s%s\", appendCharLength = %u, appendChars = %s)\n"),
                s,
                appendCharLength > 8 ? _u("...") : _u(""),
                appendCharLength,
                appendChars ? _u("true") : _u("false"));
            Output::Flush();
        }

        if(appendChars || toString->HasOnlyDirectChars())
        {
            if(appendCharLength == 1)
            {
                const char16 c = s[0];
                if(TryAppendGeneric(c, toString))
                    return;
                toString->AppendSlow(c);
                return;
            }

            // Skip the check for Block::ShouldAppendChars because the string buffer has to be copied anyway
            if(TryAppendGeneric(s, appendCharLength, toString))
                return;
            toString->AppendSlow(s, appendCharLength);
            return;
        }

        JavascriptString *const js = JavascriptString::NewCopyBuffer(s, appendCharLength, toString->GetScriptContext());
        if(TryAppendGeneric(js, appendCharLength, toString))
            return;
        toString->AppendSlow(js);
    }